

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::InitGoogleTestImpl<char>(int *argc,char **argv)

{
  bool bVar1;
  int *in_RDI;
  int i;
  value_type *in_stack_ffffffffffffffa8;
  UnitTestImpl *in_stack_ffffffffffffffb0;
  char **in_stack_ffffffffffffffd8;
  undefined4 local_14;
  
  bVar1 = GTestIsInitialized();
  if ((!bVar1) && (0 < *in_RDI)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x1a13c9);
    for (local_14 = 0; local_14 != *in_RDI; local_14 = local_14 + 1) {
      in_stack_ffffffffffffffb0 = (UnitTestImpl *)&stack0xffffffffffffffc8;
      StreamableToString<char*>(in_stack_ffffffffffffffd8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    }
    ParseGoogleTestFlagsOnly((int *)in_stack_ffffffffffffffb0,(char **)in_stack_ffffffffffffffa8);
    GetUnitTestImpl();
    UnitTestImpl::PostFlagParsingInit(in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void InitGoogleTestImpl(int* argc, CharType** argv) {
  // We don't want to run the initialization code twice.
  if (GTestIsInitialized()) return;

  if (*argc <= 0) return;

  g_argvs.clear();
  for (int i = 0; i != *argc; i++) {
    g_argvs.push_back(StreamableToString(argv[i]));
  }

#if GTEST_HAS_ABSL
  absl::InitializeSymbolizer(g_argvs[0].c_str());
#endif  // GTEST_HAS_ABSL

  ParseGoogleTestFlagsOnly(argc, argv);
  GetUnitTestImpl()->PostFlagParsingInit();
}